

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

Date * operator++(Date *date)

{
  int iVar1;
  int iVar2;
  
  iVar2 = date->month;
  iVar1 = date->day;
  date->day = iVar1 + 1;
  if (0x1e < iVar1) {
    iVar2 = iVar2 + 1;
    date->month = iVar2;
    date->day = 1;
  }
  if (0xc < iVar2) {
    date->year = date->year + 1;
    date->month = 1;
  }
  return date;
}

Assistant:

Date &operator++(Date &date) {
    date.day++;
    if (date.day > 31) {
        date.month++;
        date.day = 1;
    }
    if (date.month > 12) {
        date.year++;
        date.month = 1;
    }
    return date;
}